

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void * cimg_library::CImgDisplay::_events_thread(void *arg)

{
  undefined8 uVar1;
  int iVar2;
  X11_static *pXVar3;
  bool bVar4;
  uint local_e0;
  uint i;
  bool event_flag;
  XEvent event;
  Display *dpy;
  void *arg_local;
  
  dpy = (Display *)arg;
  pXVar3 = cimg::X11_attr();
  event.pad[0x17] = (long)pXVar3->display;
  pthread_setcanceltype(0,(int *)0x0);
  pthread_setcancelstate(0,(int *)0x0);
  if (dpy != (Display *)0x0) {
    return (void *)0x0;
  }
  do {
    cimg::mutex(0xf,1);
    iVar2 = XCheckTypedEvent(event.pad[0x17],0x21,&i);
    bVar4 = iVar2 != 0;
    if (!bVar4) {
      iVar2 = XCheckMaskEvent(event.pad[0x17],0x2807f,&i);
      bVar4 = iVar2 != 0;
    }
    if (bVar4) {
      for (local_e0 = 0; pXVar3 = cimg::X11_attr(), local_e0 < pXVar3->nb_wins;
          local_e0 = local_e0 + 1) {
        pXVar3 = cimg::X11_attr();
        uVar1 = event.xany.display;
        if (((pXVar3->wins[local_e0]->_is_closed & 1U) == 0) &&
           (pXVar3 = cimg::X11_attr(),
           (Display *)uVar1 == (Display *)pXVar3->wins[local_e0]->_window)) {
          pXVar3 = cimg::X11_attr();
          _handle_events(pXVar3->wins[local_e0],(XEvent *)&i);
        }
      }
    }
    cimg::mutex(0xf,0);
    pthread_testcancel();
    cimg::sleep(8);
  } while( true );
}

Assistant:

static void* _events_thread(void *arg) { // Thread to manage events for all opened display windows
      Display *const dpy = cimg::X11_attr().display;
      XEvent event;
      pthread_setcanceltype(PTHREAD_CANCEL_DEFERRED,0);
      pthread_setcancelstate(PTHREAD_CANCEL_ENABLE,0);
      if (!arg) for ( ; ; ) {
        cimg_lock_display();
        bool event_flag = XCheckTypedEvent(dpy,ClientMessage,&event);
        if (!event_flag) event_flag = XCheckMaskEvent(dpy,
                                                      ExposureMask | StructureNotifyMask | ButtonPressMask |
                                                      KeyPressMask | PointerMotionMask | EnterWindowMask |
                                                      LeaveWindowMask | ButtonReleaseMask | KeyReleaseMask,&event);
        if (event_flag)
          for (unsigned int i = 0; i<cimg::X11_attr().nb_wins; ++i)
            if (!cimg::X11_attr().wins[i]->_is_closed && event.xany.window==cimg::X11_attr().wins[i]->_window)
              cimg::X11_attr().wins[i]->_handle_events(&event);
        cimg_unlock_display();
        pthread_testcancel();
        cimg::sleep(8);
      }
      return 0;
    }